

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precond.c
# Opt level: O1

Vector * SSORPrecond(QMatrix *A,Vector *y,Vector *c,double Omega)

{
  QMatrix *pQVar1;
  QMatrix *pQVar2;
  QMatrix *pQVar3;
  QMatrix *Q2;
  Vector *pVVar4;
  
  Q_Lock(A);
  V_Lock(y);
  V_Lock(c);
  pQVar1 = Diag_Q(A);
  pQVar1 = Mul_SQ(1.0 / Omega,pQVar1);
  pQVar2 = Upper_Q(A);
  pQVar1 = Add_QQ(pQVar1,pQVar2);
  pQVar2 = Diag_Q(A);
  pQVar3 = Diag_Q(A);
  pQVar3 = Mul_SQ(1.0 / Omega,pQVar3);
  Q2 = Lower_Q(A);
  pQVar3 = Add_QQ(pQVar3,Q2);
  pVVar4 = MulInv_QV(pQVar3,c);
  pVVar4 = Mul_QV(pQVar2,pVVar4);
  pVVar4 = MulInv_QV(pQVar1,pVVar4);
  pVVar4 = Mul_SV((2.0 - Omega) / Omega,pVVar4);
  Asgn_VV(y,pVVar4);
  Q_Unlock(A);
  V_Unlock(y);
  V_Unlock(c);
  return y;
}

Assistant:

Vector *SSORPrecond(QMatrix *A, Vector *y, Vector *c, double Omega)
/* SSOR preconditioner */
{
    Q_Lock(A);
    V_Lock(y);
    V_Lock(c);
    
    /*
     *  1 / (2 - Omega) * (Diag(A) / Omega + Lower(A)) * (Diag(A) / Omega)^(-1)
     *      * (Diag(A) / Omega + Upper(A)) y = c
     *
     *  y = (2 - Omega) / Omega * (Diag(A) / Omega + Upper(A))^(-1) * Diag(A)
     *          * (Diag(A) / Omega + Lower(A))^(-1) c
     */

    Asgn_VV(y, Mul_SV((2.0 - Omega) / Omega,
        MulInv_QV(Add_QQ(Mul_SQ(1.0 / Omega, Diag_Q(A)), Upper_Q(A)),
        Mul_QV(Diag_Q(A),
        MulInv_QV(Add_QQ(Mul_SQ(1.0 / Omega, Diag_Q(A)), Lower_Q(A)), c)))));

    Q_Unlock(A);
    V_Unlock(y);
    V_Unlock(c);

    return(y);
}